

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O3

int run_test_error_message(void)

{
  int iVar1;
  char *pcVar2;
  char buf [32];
  undefined1 auStack_28 [40];
  
  pcVar2 = (char *)uv_strerror(0);
  iVar1 = strcmp(pcVar2,"Success");
  if (iVar1 != 0) {
    puts("i18n error messages detected, skipping test.");
    return 0;
  }
  pcVar2 = (char *)uv_strerror(0xffffffea);
  pcVar2 = strstr(pcVar2,"Success");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)uv_strerror(0x539);
    iVar1 = strcmp(pcVar2,"Unknown error");
    if (iVar1 != 0) goto LAB_0014ebb5;
    pcVar2 = (char *)uv_strerror(0xfffffac7);
    iVar1 = strcmp(pcVar2,"Unknown error");
    if (iVar1 != 0) goto LAB_0014ebba;
    pcVar2 = (char *)uv_strerror_r(0xffffffea,auStack_28,0x20);
    pcVar2 = strstr(pcVar2,"Success");
    if (pcVar2 != (char *)0x0) goto LAB_0014ebbf;
    pcVar2 = (char *)uv_strerror_r(0x539,auStack_28,0x20);
    pcVar2 = strstr(pcVar2,"1337");
    if (pcVar2 == (char *)0x0) goto LAB_0014ebc4;
    pcVar2 = (char *)uv_strerror_r(0xfffffac7,auStack_28,0x20);
    pcVar2 = strstr(pcVar2,"-1337");
    if (pcVar2 != (char *)0x0) {
      return 0;
    }
  }
  else {
    run_test_error_message_cold_1();
LAB_0014ebb5:
    run_test_error_message_cold_2();
LAB_0014ebba:
    run_test_error_message_cold_3();
LAB_0014ebbf:
    run_test_error_message_cold_4();
LAB_0014ebc4:
    run_test_error_message_cold_6();
  }
  run_test_error_message_cold_5();
  iVar1 = uv_translate_sys_error(1);
  if (iVar1 == -1) {
    iVar1 = uv_translate_sys_error(0x20);
    if (iVar1 != -0x20) goto LAB_0014ec3d;
    iVar1 = uv_translate_sys_error(0x16);
    if (iVar1 != -0x16) goto LAB_0014ec42;
    iVar1 = uv_translate_sys_error(0xffffffea);
    if (iVar1 != -0x16) goto LAB_0014ec47;
    iVar1 = uv_translate_sys_error(0xffffffde);
    if (iVar1 != -0x22) goto LAB_0014ec4c;
    iVar1 = uv_translate_sys_error(0xfffffff3);
    if (iVar1 == -0xd) {
      iVar1 = uv_translate_sys_error(0);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014ec56;
    }
  }
  else {
    run_test_sys_error_cold_1();
LAB_0014ec3d:
    run_test_sys_error_cold_2();
LAB_0014ec42:
    run_test_sys_error_cold_3();
LAB_0014ec47:
    run_test_sys_error_cold_4();
LAB_0014ec4c:
    run_test_sys_error_cold_5();
  }
  run_test_sys_error_cold_6();
LAB_0014ec56:
  run_test_sys_error_cold_7();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fail-always.c"
          ,0x1b,"Yes, it always fails");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(error_message) {
  char buf[32];

  /* Cop out. Can't do proper checks on systems with
   * i18n-ized error messages...
   */
  if (strcmp(uv_strerror(0), "Success") != 0) {
    printf("i18n error messages detected, skipping test.\n");
    return 0;
  }

  ASSERT(strstr(uv_strerror(UV_EINVAL), "Success") == NULL);
  ASSERT(strcmp(uv_strerror(1337), "Unknown error") == 0);
  ASSERT(strcmp(uv_strerror(-1337), "Unknown error") == 0);

  ASSERT(strstr(uv_strerror_r(UV_EINVAL, buf, sizeof(buf)), "Success") == NULL);
  ASSERT(strstr(uv_strerror_r(1337, buf, sizeof(buf)), "1337") != NULL);
  ASSERT(strstr(uv_strerror_r(-1337, buf, sizeof(buf)), "-1337") != NULL);

  return 0;
}